

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instancenorm.cpp
# Opt level: O0

int __thiscall
ncnn::InstanceNorm::forward_inplace(InstanceNorm *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  long in_RSI;
  long in_RDI;
  double dVar2;
  float fVar3;
  int i_2;
  float beta;
  float gamma;
  float b;
  float a;
  float var;
  int i_1;
  float tmp;
  float mean;
  int i;
  float sqsum;
  float sum;
  float *ptr;
  int q;
  int size;
  int c;
  int h;
  int w;
  int in_stack_ffffffffffffff44;
  float in_stack_ffffffffffffff48;
  float in_stack_ffffffffffffff4c;
  float local_b0;
  float local_ac;
  int local_a4;
  int local_98;
  float local_94;
  float local_90;
  Mat local_80;
  float *local_38;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  local_1c = *(int *)(in_RSI + 0x2c);
  local_20 = *(int *)(in_RSI + 0x30);
  local_24 = *(int *)(in_RSI + 0x38);
  local_28 = local_1c * local_20;
  for (local_2c = 0; local_2c < local_24; local_2c = local_2c + 1) {
    ncnn::Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                       in_stack_ffffffffffffff44);
    pfVar1 = ncnn::Mat::operator_cast_to_float_(&local_80);
    ncnn::Mat::~Mat((Mat *)0x6b9650);
    local_90 = 0.0;
    local_94 = 0.0;
    for (local_98 = 0; local_98 < local_28; local_98 = local_98 + 1) {
      local_90 = pfVar1[local_98] + local_90;
    }
    local_90 = local_90 / (float)local_28;
    for (local_a4 = 0; local_a4 < local_28; local_a4 = local_a4 + 1) {
      local_94 = (pfVar1[local_a4] - local_90) * (pfVar1[local_a4] - local_90) + local_94;
    }
    fVar3 = (float)local_28;
    local_38 = pfVar1;
    if (*(int *)(in_RDI + 0xd8) == 0) {
      dVar2 = std::sqrt((double)(ulong)(uint)(local_94 / fVar3 + *(float *)(in_RDI + 0xd4)));
      local_ac = 1.0 / SUB84(dVar2,0);
      local_b0 = -local_90 * local_ac;
    }
    else {
      pfVar1 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0xe0),(long)local_2c);
      local_ac = *pfVar1;
      pfVar1 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0x128),(long)local_2c);
      in_stack_ffffffffffffff48 = *pfVar1;
      in_stack_ffffffffffffff4c = local_ac;
      dVar2 = std::sqrt((double)(ulong)(uint)(local_94 / fVar3 + *(float *)(in_RDI + 0xd4)));
      local_ac = local_ac / SUB84(dVar2,0);
      local_b0 = -local_90 * local_ac + in_stack_ffffffffffffff48;
    }
    for (in_stack_ffffffffffffff44 = 0; in_stack_ffffffffffffff44 < local_28;
        in_stack_ffffffffffffff44 = in_stack_ffffffffffffff44 + 1) {
      local_38[in_stack_ffffffffffffff44] =
           local_38[in_stack_ffffffffffffff44] * local_ac + local_b0;
    }
  }
  return 0;
}

Assistant:

int InstanceNorm::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // x = (x - mean) / (sqrt(var + eps)) * gamma + beta

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int c = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < c; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        // mean and var
        float sum = 0.f;
        float sqsum = 0.f;
        for (int i = 0; i < size; i++)
        {
            sum += ptr[i];
            //sqsum += ptr[i] * ptr[i];
        }
        float mean = sum / size;
        float tmp = 0.f;
        for (int i = 0; i < size; i++)
        {
            tmp = ptr[i] - mean;
            sqsum += tmp * tmp;
        }
        float var = sqsum / size;
        // the var maybe minus due to accuracy
        //float var = sqsum / size - mean * mean;

        float a;
        float b;
        if (affine)
        {
            float gamma = gamma_data[q];
            float beta = beta_data[q];

            a = static_cast<float>(gamma / (sqrt(var + eps)));
            b = -mean * a + beta;
        }
        else
        {
            a = static_cast<float>(1.f / (sqrt(var + eps)));
            b = -mean * a;
        }

        for (int i = 0; i < size; i++)
        {
            ptr[i] = ptr[i] * a + b;
        }
    }

    return 0;
}